

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts3NodeAddTerm(Fts3Table *p,SegmentNode **ppTree,int isCopyTerm,char *zTerm,int nTerm)

{
  SegmentNode *pSVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  SegmentNode *pSVar7;
  undefined4 in_register_00000014;
  char *zNext;
  sqlite3_uint64 v;
  int iVar8;
  sqlite3_uint64 v_00;
  SegmentNode *pNew;
  SegmentNode *pParent;
  
  zNext = (char *)CONCAT44(in_register_00000014,isCopyTerm);
  iVar5 = (int)zTerm;
  pSVar1 = *ppTree;
  if (pSVar1 == (SegmentNode *)0x0) {
    iVar2 = p->nNodeSize;
LAB_001bdc6e:
    iVar5 = 7;
    pSVar7 = (SegmentNode *)sqlite3_malloc(iVar2 + 0x48);
    if (pSVar7 != (SegmentNode *)0x0) {
      pSVar7->zMalloc = (char *)0x0;
      *(undefined8 *)&pSVar7->nData = 0;
      pSVar7->zTerm = (char *)0x0;
      pSVar7->nTerm = 0;
      pSVar7->nMalloc = 0;
      pSVar7->pLeftmost = (SegmentNode *)0x0;
      *(undefined8 *)&pSVar7->nEntry = 0;
      pSVar7->pParent = (SegmentNode *)0x0;
      pSVar7->pRight = (SegmentNode *)0x0;
      pSVar7->nData = 0xb;
      pSVar7->aData = (char *)(pSVar7 + 1);
      pNew = pSVar7;
      if (pSVar1 == (SegmentNode *)0x0) {
        pSVar7->pLeftmost = pSVar7;
        iVar5 = fts3NodeAddTerm(p,&pNew,isCopyTerm,(char *)((ulong)zTerm & 0xffffffff),nTerm);
      }
      else {
        pParent = pSVar1->pParent;
        iVar5 = fts3NodeAddTerm(p,&pParent,isCopyTerm,(char *)((ulong)zTerm & 0xffffffff),nTerm);
        if (pSVar1->pParent == (SegmentNode *)0x0) {
          pSVar1->pParent = pParent;
        }
        pSVar1->pRight = pSVar7;
        pSVar7->pLeftmost = pSVar1->pLeftmost;
        pSVar7->pParent = pParent;
        pSVar7->zMalloc = pSVar1->zMalloc;
        pSVar7->nMalloc = pSVar1->nMalloc;
        pSVar1->zMalloc = (char *)0x0;
        pNew = pSVar7;
      }
      *ppTree = pNew;
    }
  }
  else {
    iVar4 = pSVar1->nData;
    pcVar6 = pSVar1->zTerm;
    iVar2 = fts3PrefixCompress(pcVar6,pSVar1->nTerm,zNext,iVar5);
    iVar8 = iVar5 - iVar2;
    v = (sqlite3_uint64)iVar2;
    iVar2 = sqlite3Fts3VarintLen(v);
    v_00 = (sqlite3_uint64)iVar8;
    iVar3 = sqlite3Fts3VarintLen(v_00);
    iVar3 = iVar2 + iVar8 + iVar4 + iVar3;
    iVar2 = p->nNodeSize;
    if (iVar2 < iVar3) {
      if (pcVar6 != (char *)0x0) goto LAB_001bdc6e;
      pcVar6 = (char *)sqlite3_malloc(iVar3);
      pSVar1->aData = pcVar6;
      if (pcVar6 == (char *)0x0) {
        return 7;
      }
      pcVar6 = pSVar1->zTerm;
    }
    if (pcVar6 != (char *)0x0) {
      iVar2 = sqlite3Fts3PutVarint(pSVar1->aData + iVar4,v);
      iVar4 = iVar2 + iVar4;
    }
    iVar2 = sqlite3Fts3PutVarint(pSVar1->aData + iVar4,v_00);
    memcpy(pSVar1->aData + (iVar4 + iVar2),zNext + v,v_00);
    pSVar1->nData = iVar4 + iVar2 + iVar8;
    pSVar1->nEntry = pSVar1->nEntry + 1;
    pcVar6 = pSVar1->zMalloc;
    if (pSVar1->nMalloc < iVar5) {
      pcVar6 = (char *)sqlite3_realloc(pcVar6,iVar5 * 2);
      if (pcVar6 == (char *)0x0) {
        return 7;
      }
      pSVar1->nMalloc = iVar5 * 2;
      pSVar1->zMalloc = pcVar6;
    }
    pSVar1->zTerm = pcVar6;
    memcpy(pcVar6,zNext,(long)iVar5);
    pSVar1->nTerm = iVar5;
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

static int fts3NodeAddTerm(
  Fts3Table *p,                   /* Virtual table handle */
  SegmentNode **ppTree,           /* IN/OUT: SegmentNode handle */ 
  int isCopyTerm,                 /* True if zTerm/nTerm is transient */
  const char *zTerm,              /* Pointer to buffer containing term */
  int nTerm                       /* Size of term in bytes */
){
  SegmentNode *pTree = *ppTree;
  int rc;
  SegmentNode *pNew;

  /* First try to append the term to the current node. Return early if 
  ** this is possible.
  */
  if( pTree ){
    int nData = pTree->nData;     /* Current size of node in bytes */
    int nReq = nData;             /* Required space after adding zTerm */
    int nPrefix;                  /* Number of bytes of prefix compression */
    int nSuffix;                  /* Suffix length */

    nPrefix = fts3PrefixCompress(pTree->zTerm, pTree->nTerm, zTerm, nTerm);
    nSuffix = nTerm-nPrefix;

    nReq += sqlite3Fts3VarintLen(nPrefix)+sqlite3Fts3VarintLen(nSuffix)+nSuffix;
    if( nReq<=p->nNodeSize || !pTree->zTerm ){

      if( nReq>p->nNodeSize ){
        /* An unusual case: this is the first term to be added to the node
        ** and the static node buffer (p->nNodeSize bytes) is not large
        ** enough. Use a separately malloced buffer instead This wastes
        ** p->nNodeSize bytes, but since this scenario only comes about when
        ** the database contain two terms that share a prefix of almost 2KB, 
        ** this is not expected to be a serious problem. 
        */
        assert( pTree->aData==(char *)&pTree[1] );
        pTree->aData = (char *)sqlite3_malloc(nReq);
        if( !pTree->aData ){
          return SQLITE_NOMEM;
        }
      }

      if( pTree->zTerm ){
        /* There is no prefix-length field for first term in a node */
        nData += sqlite3Fts3PutVarint(&pTree->aData[nData], nPrefix);
      }

      nData += sqlite3Fts3PutVarint(&pTree->aData[nData], nSuffix);
      memcpy(&pTree->aData[nData], &zTerm[nPrefix], nSuffix);
      pTree->nData = nData + nSuffix;
      pTree->nEntry++;

      if( isCopyTerm ){
        if( pTree->nMalloc<nTerm ){
          char *zNew = sqlite3_realloc(pTree->zMalloc, nTerm*2);
          if( !zNew ){
            return SQLITE_NOMEM;
          }
          pTree->nMalloc = nTerm*2;
          pTree->zMalloc = zNew;
        }
        pTree->zTerm = pTree->zMalloc;
        memcpy(pTree->zTerm, zTerm, nTerm);
        pTree->nTerm = nTerm;
      }else{
        pTree->zTerm = (char *)zTerm;
        pTree->nTerm = nTerm;
      }
      return SQLITE_OK;
    }
  }

  /* If control flows to here, it was not possible to append zTerm to the
  ** current node. Create a new node (a right-sibling of the current node).
  ** If this is the first node in the tree, the term is added to it.
  **
  ** Otherwise, the term is not added to the new node, it is left empty for
  ** now. Instead, the term is inserted into the parent of pTree. If pTree 
  ** has no parent, one is created here.
  */
  pNew = (SegmentNode *)sqlite3_malloc(sizeof(SegmentNode) + p->nNodeSize);
  if( !pNew ){
    return SQLITE_NOMEM;
  }
  memset(pNew, 0, sizeof(SegmentNode));
  pNew->nData = 1 + FTS3_VARINT_MAX;
  pNew->aData = (char *)&pNew[1];

  if( pTree ){
    SegmentNode *pParent = pTree->pParent;
    rc = fts3NodeAddTerm(p, &pParent, isCopyTerm, zTerm, nTerm);
    if( pTree->pParent==0 ){
      pTree->pParent = pParent;
    }
    pTree->pRight = pNew;
    pNew->pLeftmost = pTree->pLeftmost;
    pNew->pParent = pParent;
    pNew->zMalloc = pTree->zMalloc;
    pNew->nMalloc = pTree->nMalloc;
    pTree->zMalloc = 0;
  }else{
    pNew->pLeftmost = pNew;
    rc = fts3NodeAddTerm(p, &pNew, isCopyTerm, zTerm, nTerm); 
  }

  *ppTree = pNew;
  return rc;
}